

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

size_t gnuplotio::
       get_range_size<gnuplotio::PairOfRange<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>>>
                 (PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
                  *arg)

{
  bool bVar1;
  size_t sVar2;
  PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
  i;
  PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
  local_38;
  
  local_38.l.it = (arg->l).it;
  local_38.l.end = (arg->l).end;
  local_38.r.it = (arg->r).it;
  local_38.r.end = (arg->r).end;
  bVar1 = PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
          ::is_end(&local_38);
  sVar2 = 0;
  while (!bVar1) {
    local_38.l.it = local_38.l.it + 1;
    sVar2 = sVar2 + 1;
    local_38.r.it = local_38.r.it + 1;
    bVar1 = PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
            ::is_end(&local_38);
  }
  return sVar2;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}